

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  pointer pvVar1;
  pointer ppcVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  const_iterator pit;
  pointer ppcVar7;
  uint local_20c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  cmGeneratorExpressionNode *local_1c0;
  pointer local_1b8;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_1b0;
  string parameter;
  
  local_1e8 = __return_storage_ptr__;
  uVar3 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = node;
  iVar4 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_20c = 1;
  local_1b8 = pvVar1;
  while (psVar6 = local_1e8, pit._M_current != local_1b8) {
    if ((local_20c == uVar3 & (byte)iVar4) == 1) {
      ProcessArbitraryContent(&parameter,this,local_1c0,identifier,context,dagChecker,pit);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                 &parameter);
      std::__cxx11::string::~string((string *)&parameter);
      psVar6 = local_1e8;
      goto LAB_002d95c9;
    }
    parameter._M_dataplus._M_p = (pointer)&parameter.field_2;
    parameter._M_string_length = 0;
    parameter.field_2._M_local_buf[0] = '\0';
    ppcVar7 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_1b0 = pit._M_current;
    while (ppcVar7 != ppcVar2) {
      (*(*ppcVar7)->_vptr_cmGeneratorExpressionEvaluator[3])(&local_208,*ppcVar7,context,dagChecker)
      ;
      std::__cxx11::string::append((string *)&parameter);
      std::__cxx11::string::~string((string *)&local_208);
      psVar6 = local_1e8;
      ppcVar7 = ppcVar7 + 1;
      if (context->HadError != false) {
        (local_1e8->_M_dataplus)._M_p = (pointer)&local_1e8->field_2;
        local_1e8->_M_string_length = 0;
        (local_1e8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::~string((string *)&parameter);
        return psVar6;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
               &parameter);
    std::__cxx11::string::~string((string *)&parameter);
    local_20c = local_20c + 1;
    pit._M_current = local_1b0 + 1;
  }
  if (((int)uVar3 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)uVar3)) {
    if (uVar3 == 0xfffffffe) {
      if ((ulong)((long)(parameters->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_002d95c9;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1e0,"$<",identifier);
      std::operator+(&local_208,&local_1e0,"> expression requires one or zero parameters.");
      reportError(context,&parameter,&local_208);
    }
    else {
      if ((uVar3 != 0xffffffff) ||
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_002d95c9;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1e0,"$<",identifier);
      std::operator+(&local_208,&local_1e0,"> expression requires at least one parameter.");
      reportError(context,&parameter,&local_208);
    }
  }
  else {
    if (uVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameter);
      std::operator+(&local_1e0,"$<",identifier);
      std::operator+(&local_208,&local_1e0,"> expression requires ");
      poVar5 = std::operator<<((ostream *)&parameter,(string *)&local_208);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
      poVar5 = std::operator<<(poVar5," comma separated parameters, but got ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," instead.");
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e0);
      GetOriginalExpression_abi_cxx11_(&local_208,this);
      std::__cxx11::stringbuf::str();
      reportError(context,&local_208,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameter);
      goto LAB_002d95c9;
    }
    GetOriginalExpression_abi_cxx11_(&parameter,this);
    std::operator+(&local_1e0,"$<",identifier);
    std::operator+(&local_208,&local_1e0,"> expression requires exactly one parameter.");
    reportError(context,&parameter,&local_208);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&parameter);
LAB_002d95c9:
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  psVar6->_M_string_length = 0;
  (psVar6->field_2)._M_local_buf[0] = '\0';
  return psVar6;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    std::vector<std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator
      pit = this->ParamChildren.begin();
    const std::vector<
      std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator pend =
      this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        parameters.push_back(this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit));
        return std::string();
      }
      std::string parameter;
      for (cmGeneratorExpressionEvaluator* pExprEval : *pit) {
        parameter += pExprEval->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(std::move(parameter));
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       static_cast<unsigned int>(numExpected) != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least one parameter.");
  }
  if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
      parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}